

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)1>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  pointer pdVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  uint uVar8;
  size_t sVar9;
  size_type sVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pdVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  size_type __n;
  pointer piVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  Data2D<double> vals;
  vector<int,_std::allocator<int>_> levels;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<double,_std::allocator<double>_> norm;
  Data2D<int> dagUp;
  SplitDirections split;
  uint local_194;
  allocator_type local_161;
  double *local_160;
  double *local_158;
  pointer local_150;
  double *local_148;
  long local_140;
  pointer local_138;
  long local_130;
  long local_128;
  vector<double,_std::allocator<double>_> local_120;
  pointer local_108;
  long local_100;
  long local_f8;
  size_t local_f0;
  ulong local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  Data2D<int> local_98;
  SplitDirections local_70;
  Data2D<int> *local_40;
  ulong local_38;
  
  iVar6 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)iVar6;
  sVar9 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_98.stride = CONCAT44(local_98.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_158 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_70.job_directions,sVar9 * __n,(value_type_conflict3 *)&local_98,
             (allocator_type *)&local_130);
  local_108 = local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  piVar22 = local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar9;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_f0 = sVar9;
    local_40 = __return_storage_ptr__;
    getNormalization(&local_b0,this);
    uVar8 = 1;
    if (output == -1) {
      uVar8 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_140 = (long)(int)uVar8;
    local_148 = (double *)0x0;
    local_150 = (pointer)0x0;
    if (local_158 == (double *)0x0) {
      local_98.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_70,local_140 * __n,
                 (value_type_conflict2 *)&local_98,(allocator_type *)&local_130);
      local_158 = (double *)
                  local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_148 = (double *)
                  local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_150 = local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    }
    auVar5 = _DAT_001ca0b0;
    auVar4 = _DAT_001ca070;
    auVar3 = _DAT_001ca060;
    if (criteria < refine_direction_selective) {
      if (0 < iVar6) {
        sVar9 = (this->surpluses).stride;
        pdVar1 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar22 = (pointer)((long)piVar22 + 0xc);
        sVar10 = 0;
        do {
          lVar11 = sVar9 * sVar10;
          if (output == -1) {
            lVar15 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar15) {
              bVar23 = true;
              lVar7 = 0;
              do {
                while (bVar23) {
                  dVar25 = (ABS(pdVar1[lVar11 + lVar7]) * (local_158 + sVar10 * local_140)[lVar7]) /
                           local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar7];
                  bVar23 = dVar25 <= tolerance;
                  lVar7 = lVar7 + 1;
                  if (lVar7 == lVar15) goto LAB_001a26de;
                }
                lVar7 = lVar7 + 1;
                bVar23 = false;
              } while (lVar7 != lVar15);
              goto LAB_001a2743;
            }
          }
          else {
            dVar25 = (ABS(pdVar1[lVar11 + output]) * local_158[sVar10 * local_140]) /
                     local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output];
LAB_001a26de:
            if (tolerance < dVar25) {
LAB_001a2743:
              lVar11 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
              if (0 < lVar11) {
                uVar12 = lVar11 + 0x3fffffffffffffff;
                uVar13 = uVar12 & 0x3fffffffffffffff;
                auVar26._8_4_ = (int)uVar13;
                auVar26._0_8_ = uVar13;
                auVar26._12_4_ = (int)(uVar13 >> 0x20);
                auVar26 = auVar26 ^ auVar3;
                lVar11 = 0;
                do {
                  auVar27._8_4_ = (int)lVar11;
                  auVar27._0_8_ = lVar11;
                  auVar27._12_4_ = (int)((ulong)lVar11 >> 0x20);
                  auVar28 = (auVar27 | auVar4) ^ auVar3;
                  iVar6 = auVar26._4_4_;
                  if ((bool)(~(iVar6 < auVar28._4_4_ ||
                              auVar26._0_4_ < auVar28._0_4_ && auVar28._4_4_ == iVar6) & 1)) {
                    piVar22[lVar11 + -3] = 1;
                  }
                  if (auVar28._12_4_ <= auVar26._12_4_ &&
                      (auVar28._8_4_ <= auVar26._8_4_ || auVar28._12_4_ != auVar26._12_4_)) {
                    piVar22[lVar11 + -2] = 1;
                  }
                  auVar27 = (auVar27 | auVar5) ^ auVar3;
                  iVar29 = auVar27._4_4_;
                  if (iVar29 <= iVar6 && (iVar29 != iVar6 || auVar27._0_4_ <= auVar26._0_4_)) {
                    piVar22[lVar11 + -1] = 1;
                    piVar22[lVar11] = 1;
                  }
                  lVar11 = lVar11 + 4;
                } while ((uVar13 - ((uint)uVar12 & 3)) + 4 != lVar11);
              }
            }
          }
          sVar10 = sVar10 + 1;
          piVar22 = piVar22 + local_f0;
        } while (sVar10 != __n);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)1>(&local_98,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_70,mset);
      iVar6 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_70);
      ::std::vector<int,_std::allocator<int>_>::vector(&local_c8,__n,(allocator_type *)&local_130);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_e0,(long)iVar6,(allocator_type *)&local_130);
      if (0 < (int)((ulong)((long)local_70.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_70.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_f8 = (long)output;
        lVar11 = 0;
        local_160 = (double *)piVar22;
        do {
          lVar15 = (long)*(int *)((long)local_70.job_directions.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar11 * 4);
          local_138 = local_70.job_pnts.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar11].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
          uVar12 = (ulong)((long)local_70.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)local_138) >> 2;
          local_130 = local_140;
          uVar16 = (uint)uVar12;
          local_128 = (long)(int)uVar16;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_120,local_128 * local_140,&local_161);
          local_e8 = uVar12;
          if (output == -1) {
            if (0 < (int)uVar16) {
              uVar12 = 0;
              local_194 = 0;
              local_100 = lVar11;
              do {
                piVar22 = local_138;
                lVar11 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (0 < lVar11) {
                  memmove(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + local_130 * uVar12,
                          (this->super_BaseCanonicalGrid).values.values.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)local_138[uVar12] *
                          (this->super_BaseCanonicalGrid).values.num_outputs,lVar11 << 3);
                }
                local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[piVar22[uVar12]] = (int)uVar12;
                uVar21 = (this->super_BaseCanonicalGrid).points.indexes.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)piVar22[uVar12] *
                          (this->super_BaseCanonicalGrid).points.num_dimensions + lVar15];
                uVar17 = uVar21;
                if ((1 < uVar21) && (uVar17 = 1, uVar21 != 2)) {
                  uVar21 = uVar21 - 1;
                  do {
                    uVar21 = (int)uVar21 >> 1;
                    uVar17 = uVar17 + 1;
                  } while (1 < uVar21);
                }
                local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] = uVar17;
                if ((int)local_194 <= (int)uVar17) {
                  local_194 = uVar17;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != (uVar16 & 0x7fffffff));
              goto LAB_001a2b28;
            }
          }
          else if (0 < (int)uVar16) {
            sVar9 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            pdVar1 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar2 = (this->super_BaseCanonicalGrid).values.num_outputs;
            piVar22 = (this->super_BaseCanonicalGrid).points.indexes.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            uVar12 = 0;
            local_194 = 0;
            do {
              iVar6 = local_138[uVar12];
              local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_130 * uVar12] =
                   pdVar1[local_f8 + sVar2 * (long)iVar6];
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar6] = (int)uVar12;
              uVar21 = piVar22[lVar15 + (long)local_138[uVar12] * sVar9];
              uVar17 = uVar21;
              if ((1 < uVar21) && (uVar17 = 1, uVar21 != 2)) {
                uVar21 = uVar21 - 1;
                do {
                  uVar21 = (int)uVar21 >> 1;
                  uVar17 = uVar17 + 1;
                } while (1 < uVar21);
              }
              local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar12] = uVar17;
              if ((int)local_194 <= (int)uVar17) {
                local_194 = uVar17;
              }
              uVar12 = uVar12 + 1;
              local_100 = lVar11;
            } while (uVar12 != (uVar16 & 0x7fffffff));
LAB_001a2b28:
            uVar16 = (uint)local_e8;
            if (0 < (int)local_194) {
              local_38 = (ulong)(uVar16 & 0x7fffffff);
              uVar21 = 1;
              do {
                if (0 < (int)local_e8) {
                  lVar11 = 0;
                  uVar12 = 0;
                  do {
                    piVar22 = local_138;
                    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar12] == uVar21) {
                      dVar25 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)1>
                                         ((this->super_BaseCanonicalGrid).points.indexes.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start
                                          [(long)local_138[uVar12] *
                                           (this->super_BaseCanonicalGrid).points.num_dimensions +
                                           lVar15]);
                      pdVar1 = local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start;
                      iVar6 = local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [(long)piVar22[uVar12] * local_98.stride + lVar15];
                      if (iVar6 != -1) {
                        lVar7 = local_130 * lVar11;
                        do {
                          lVar19 = (long)iVar6;
                          dVar24 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)1>
                                             (this->order,
                                              (this->super_BaseCanonicalGrid).points.indexes.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start
                                              [(this->super_BaseCanonicalGrid).points.num_dimensions
                                               * lVar19 + lVar15],dVar25);
                          if (0 < (int)uVar8) {
                            iVar6 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar19];
                            uVar13 = 0;
                            do {
                              *(double *)((long)pdVar1 + uVar13 * 8 + lVar7) =
                                   local_120.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [iVar6 * local_130 + uVar13] * -dVar24 +
                                   *(double *)((long)pdVar1 + uVar13 * 8 + lVar7);
                              uVar13 = uVar13 + 1;
                            } while (uVar8 != uVar13);
                          }
                          iVar6 = local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start
                                  [lVar19 * local_98.stride + lVar15];
                        } while (iVar6 != -1);
                      }
                    }
                    uVar12 = uVar12 + 1;
                    lVar11 = lVar11 + 8;
                  } while (uVar12 != local_38);
                }
                bVar23 = uVar21 != local_194;
                uVar16 = (uint)local_e8;
                uVar21 = uVar21 + 1;
              } while (bVar23);
            }
            lVar11 = local_100;
            if (0 < (int)uVar16) {
              sVar9 = (this->surpluses).stride;
              pdVar1 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar12 = 0;
              pdVar14 = local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                lVar19 = (long)local_138[uVar12];
                lVar7 = sVar9 * lVar19;
                if (output == -1) {
                  lVar18 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                  bVar23 = true;
                  if (0 < lVar18) {
                    lVar20 = 0;
                    do {
                      if (bVar23 == false) {
                        bVar23 = false;
                      }
                      else {
                        dVar25 = (local_158 + lVar19 * local_140)[lVar20];
                        bVar23 = true;
                        if (tolerance <
                            (ABS(pdVar1[lVar7 + lVar20]) * dVar25) /
                            local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar20]) {
                          bVar23 = (dVar25 * ABS(pdVar14[lVar20])) /
                                   local_b0.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar20] <= tolerance;
                        }
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar18 != lVar20);
                  }
                }
                else {
                  dVar25 = local_158[lVar19 * local_140];
                  bVar23 = true;
                  if (tolerance <
                      (ABS(pdVar1[lVar7 + local_f8]) * dVar25) /
                      local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_f8]) {
                    bVar23 = (dVar25 * ABS(local_120.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [local_130 * uVar12])) /
                             local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[local_f8] <= tolerance;
                  }
                }
                *(uint *)((long)local_160 + lVar19 * local_f0 * 4 + lVar15 * 4) = (uint)(bVar23 ^ 1)
                ;
                uVar12 = uVar12 + 1;
                pdVar14 = pdVar14 + local_130;
              } while (uVar12 != (uVar16 & 0x7fffffff));
            }
          }
          if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_120.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_120.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (int)((ulong)((long)local_70.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_70.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_70);
      if (local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_148 != (double *)0x0) {
      operator_delete(local_148,(long)local_150 - (long)local_148);
    }
    __return_storage_ptr__ = local_40;
    if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}